

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
winmd::reader::parse_array_sizes
          (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,table_base *param_1,byte_view *data)

{
  uint32_t local_54;
  uint local_50;
  uint32_t size;
  uint32_t i;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  uint32_t num_sizes;
  uint32_t rank;
  byte_view *data_local;
  table_base *param_0_local;
  
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uncompress_unsigned(data);
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = uncompress_unsigned(data);
  cppwinrt::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  cppwinrt::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
             (ulong)(uint32_t)
                    sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  for (local_50 = 0;
      local_50 <
      (uint32_t)
      sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; local_50 = local_50 + 1) {
    local_54 = uncompress_unsigned(data);
    cppwinrt::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&local_54);
  }
  cppwinrt::std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
            (__return_storage_ptr__,
             (uint *)((long)&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  cppwinrt::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<uint32_t, std::vector<uint32_t>> parse_array_sizes(table_base const*, byte_view& data)
    {
        uint32_t const rank = uncompress_unsigned(data);
        uint32_t const num_sizes = uncompress_unsigned(data);
        std::vector<uint32_t> sizes;
        sizes.reserve(num_sizes);
        for (uint32_t i = 0; i < num_sizes; ++i)
        {
            auto size = uncompress_unsigned(data);
            sizes.push_back(size);
        }
        return { rank, sizes };
    }